

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void vm_init(VM *vm)

{
  VM *pVVar1;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  VM *local_10;
  VM *vm_local;
  
  local_10 = vm;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"global\\int\\+\\(global\\int\\\\global\\int\\*\\)global\\int\\",&local_31);
  VM::addOverride(vm,(string *)local_30,x86_add);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pVVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,"global\\int\\-\\(global\\int\\\\global\\int\\*\\)global\\int\\",&local_69);
  VM::addOverride(pVVar1,(string *)local_68,x86_sub);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pVVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_90,"global\\int\\*\\(global\\int\\\\global\\int\\*\\)global\\int\\",&local_91);
  VM::addOverride(pVVar1,(string *)local_90,x86_mul);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pVVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_b8,"global\\int\\/\\(global\\int\\\\global\\int\\*\\)global\\int\\",&local_b9);
  VM::addOverride(pVVar1,(string *)local_b8,x86_div);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  pVVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,"global\\int\\<\\(global\\int\\\\global\\int\\*\\)global\\bool\\",&local_e1);
  VM::addOverride(pVVar1,(string *)local_e0,x86_lt);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  pVVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_108,"global\\int\\>\\(global\\int\\\\global\\int\\*\\)global\\bool\\",&local_109)
  ;
  VM::addOverride(pVVar1,(string *)local_108,x86_gt);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pVVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"global\\print\\(global\\int\\\\)",&local_131);
  VM::addOverride(pVVar1,(string *)local_130,print);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  pVVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"global\\print\\(global\\bool\\\\)",&local_159);
  VM::addOverride(pVVar1,(string *)local_158,print_bool);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  return;
}

Assistant:

void vm_init(VM* vm) {
  vm->addOverride("global\\int\\+\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_add);
  vm->addOverride("global\\int\\-\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_sub);
  vm->addOverride("global\\int\\*\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_mul);
  vm->addOverride("global\\int\\/\\(global\\int\\\\global\\int\\*\\)global\\int\\",(void*)&x86_div);
  vm->addOverride("global\\int\\<\\(global\\int\\\\global\\int\\*\\)global\\bool\\",(void*)&x86_lt);
  vm->addOverride("global\\int\\>\\(global\\int\\\\global\\int\\*\\)global\\bool\\",(void*)&x86_gt);
  vm->addOverride("global\\print\\(global\\int\\\\)",(void*)&print);
  vm->addOverride("global\\print\\(global\\bool\\\\)",(void*)&print_bool);
  
}